

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsTime helicsFederateRequestNextStep(HelicsFederate fed,HelicsError *err)

{
  Federate *this;
  Time TVar1;
  HelicsTime HVar2;
  
  this = getFed(fed,err);
  if (this == (Federate *)0x0) {
    HVar2 = -1.785e+39;
  }
  else {
    TVar1 = helics::Federate::requestNextStep(this);
    if (TVar1.internalTimeCode == 0x7fffffffffffffff) {
      HVar2 = 9223372036.854774;
    }
    else {
      HVar2 = (double)(TVar1.internalTimeCode % 1000000000) * 1e-09 +
              (double)(TVar1.internalTimeCode / 1000000000);
    }
  }
  return HVar2;
}

Assistant:

HelicsTime helicsFederateRequestNextStep(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeret = fedObj->requestNextStep();
        return (timeret < helics::Time::maxVal()) ? static_cast<double>(timeret) : HELICS_TIME_MAXTIME;
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
}